

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase682::run(TestCase682 *this)

{
  PathPtr fromPath;
  PathPtr toPath;
  char *pcVar1;
  size_t sVar2;
  String *pSVar3;
  ReadableFile *pRVar4;
  String *fromDirectory;
  undefined1 uVar5;
  InMemoryFileFactory *pIVar6;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  StringPtr text;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text_00;
  StringPtr name;
  StringPtr name_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_02;
  PathPtr path_02;
  ArrayPtr<const_kj::StringPtr> parts_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  ArrayPtr<const_kj::StringPtr> parts_05;
  DebugExpression<bool> _kjCondition_2;
  Own<kj::Directory,_std::nullptr_t> dst;
  Own<kj::Directory,_std::nullptr_t> src;
  DebugComparison<kj::String,_const_char_(&)[7]> _kjCondition;
  TestClock clock;
  DebugExpression<kj::String> local_148;
  Path local_128;
  undefined8 local_110;
  char *local_108;
  undefined8 local_100;
  FsNode local_f8;
  ReadableFile *local_f0;
  undefined8 *local_e8;
  String *local_e0;
  undefined8 *local_d8;
  String *local_d0;
  String local_c8;
  Path local_a8;
  DebugComparison<kj::String,_const_char_(&)[7]> local_88;
  TestClock local_50;
  String *local_40;
  size_t sStack_38;
  
  local_50.super_Clock._vptr_Clock = (_func_int **)&PTR_now_006363b8;
  local_50.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  pIVar6 = defaultInMemoryFileFactory();
  newInMemoryDirectory((kj *)&local_d8,&local_50.super_Clock,pIVar6);
  pIVar6 = defaultInMemoryFileFactory();
  newInMemoryDirectory((kj *)&local_e8,&local_50.super_Clock,pIVar6);
  pSVar3 = local_d0;
  local_88.left.content.ptr = "foo";
  local_88.left.content.size_ = 4;
  local_88.left.content.disposer = (ArrayDisposer *)0x4d67ef;
  local_88.right = (char (*) [7])&DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&local_88;
  Path::Path(&local_128,parts);
  path.parts.size_ = (size_t)local_128.parts.ptr;
  path.parts.ptr = pSVar3;
  Directory::openFile((Directory *)&local_148,path,(WriteMode)local_128.parts.size_);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_148.value.content.size_,text);
  sVar2 = local_148.value.content.size_;
  if ((File *)local_148.value.content.size_ != (File *)0x0) {
    local_148.value.content.size_ = 0;
    (*(code *)**(undefined8 **)local_148.value.content.ptr)
              (local_148.value.content.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_128.parts.size_;
  pSVar3 = local_128.parts.ptr;
  if (local_128.parts.ptr != (String *)0x0) {
    local_128.parts.ptr = (String *)0x0;
    local_128.parts.size_ = 0;
    (**(local_128.parts.disposer)->_vptr_ArrayDisposer)
              (local_128.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar3 = local_d0;
  local_88.left.content.ptr = "foo";
  local_88.left.content.size_ = 4;
  local_88.left.content.disposer = (ArrayDisposer *)0x4c8534;
  local_88.right = (char (*) [7])&DAT_00000004;
  local_88.op.content.ptr = "qux";
  local_88.op.content.size_ = 4;
  parts_00.size_ = 3;
  parts_00.ptr = (StringPtr *)&local_88;
  Path::Path(&local_128,parts_00);
  path_00.parts.size_ = (size_t)local_128.parts.ptr;
  path_00.parts.ptr = pSVar3;
  Directory::openFile((Directory *)&local_148,path_00,(WriteMode)local_128.parts.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_148.value.content.size_,text_00);
  sVar2 = local_148.value.content.size_;
  if ((File *)local_148.value.content.size_ != (File *)0x0) {
    local_148.value.content.size_ = 0;
    (*(code *)**(undefined8 **)local_148.value.content.ptr)
              (local_148.value.content.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_128.parts.size_;
  pSVar3 = local_128.parts.ptr;
  if (local_128.parts.ptr != (String *)0x0) {
    local_128.parts.ptr = (String *)0x0;
    local_128.parts.size_ = 0;
    (**(local_128.parts.disposer)->_vptr_ArrayDisposer)
              (local_128.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  TestClock::expectChanged(&local_50,(FsNode *)local_d0);
  TestClock::expectUnchanged(&local_50,(FsNode *)local_e0);
  pSVar3 = local_e0;
  name.content.size_ = 5;
  name.content.ptr = "link";
  Path::Path((Path *)&local_88,name);
  fromDirectory = local_d0;
  toPath.parts.size_ = local_88.left.content.size_;
  toPath.parts.ptr = (String *)local_88.left.content.ptr;
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  Path::Path(&local_128,name_00);
  local_40 = local_128.parts.ptr;
  sStack_38 = local_128.parts.size_;
  fromPath.parts.size_ = local_128.parts.size_;
  fromPath.parts.ptr = local_128.parts.ptr;
  Directory::transfer((Directory *)pSVar3,toPath,CREATE,(Directory *)fromDirectory,fromPath,LINK);
  sVar2 = local_128.parts.size_;
  pSVar3 = local_128.parts.ptr;
  if (local_128.parts.ptr != (String *)0x0) {
    local_128.parts.ptr = (String *)0x0;
    local_128.parts.size_ = 0;
    (**(local_128.parts.disposer)->_vptr_ArrayDisposer)
              (local_128.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar2 = local_88.left.content.size_;
  pcVar1 = local_88.left.content.ptr;
  if ((String *)local_88.left.content.ptr != (String *)0x0) {
    local_88.left.content.ptr = (char *)0x0;
    local_88.left.content.size_ = 0;
    (**(local_88.left.content.disposer)->_vptr_ArrayDisposer)
              (local_88.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  TestClock::expectUnchanged(&local_50,(FsNode *)local_d0);
  TestClock::expectChanged(&local_50,(FsNode *)local_e0);
  pSVar3 = local_e0;
  local_128.parts.ptr = (String *)0x4e5b34;
  local_128.parts.size_ = 5;
  local_128.parts.disposer = (ArrayDisposer *)0x4d67ef;
  local_110 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_128;
  Path::Path(&local_a8,parts_01);
  path_01.parts.size_ = (size_t)local_a8.parts.ptr;
  path_01.parts.ptr = pSVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&local_f8,path_01);
  ReadableFile::readAllText(&local_c8,local_f0);
  local_148.value.content.ptr = local_c8.content.ptr;
  local_148.value.content.size_ = local_c8.content.size_;
  local_148.value.content.disposer = local_c8.content.disposer;
  local_c8.content.ptr = (char *)0x0;
  local_c8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==(&local_88,&local_148,(char (*) [7])0x4f8dfd);
  sVar2 = local_148.value.content.size_;
  pcVar1 = local_148.value.content.ptr;
  if (local_148.value.content.ptr != (char *)0x0) {
    local_148.value.content.ptr = (char *)0x0;
    local_148.value.content.size_ = 0;
    (**(local_148.value.content.disposer)->_vptr_ArrayDisposer)
              (local_148.value.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar4 = local_f0;
  if (local_f0 != (ReadableFile *)0x0) {
    local_f0 = (ReadableFile *)0x0;
    (**(code **)*local_f8._vptr_FsNode)
              (local_f8._vptr_FsNode,
               (pRVar4->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar4->super_FsNode);
  }
  sVar2 = local_a8.parts.size_;
  pSVar3 = local_a8.parts.ptr;
  if (local_a8.parts.ptr != (String *)0x0) {
    local_a8.parts.ptr = (String *)0x0;
    local_a8.parts.size_ = 0;
    (**(local_a8.parts.disposer)->_vptr_ArrayDisposer)
              (local_a8.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_88.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[81],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,699,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\", _kjCondition"
               ,(char (*) [81])
                "failed: expected dst->openFile(Path({\"link\", \"bar\"}))->readAllText() == \"foobar\""
               ,&local_88);
  }
  sVar2 = local_88.left.content.size_;
  pcVar1 = local_88.left.content.ptr;
  if ((String *)local_88.left.content.ptr != (String *)0x0) {
    local_88.left.content.ptr = (char *)0x0;
    local_88.left.content.size_ = 0;
    (**(local_88.left.content.disposer)->_vptr_ArrayDisposer)
              (local_88.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pSVar3 = local_e0;
  local_128.parts.ptr = (String *)0x4e5b34;
  local_128.parts.size_ = 5;
  local_128.parts.disposer = (ArrayDisposer *)0x4c8534;
  local_110 = 4;
  local_108 = "qux";
  local_100 = 4;
  parts_02.size_ = 3;
  parts_02.ptr = (StringPtr *)&local_128;
  Path::Path(&local_a8,parts_02);
  path_02.parts.size_ = (size_t)local_a8.parts.ptr;
  path_02.parts.ptr = pSVar3;
  ReadableDirectory::openFile((ReadableDirectory *)&local_f8,path_02);
  ReadableFile::readAllText(&local_c8,local_f0);
  local_148.value.content.ptr = local_c8.content.ptr;
  local_148.value.content.size_ = local_c8.content.size_;
  local_148.value.content.disposer = local_c8.content.disposer;
  local_c8.content.ptr = (char *)0x0;
  local_c8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==(&local_88,&local_148,(char (*) [7])"bazqux");
  sVar2 = local_148.value.content.size_;
  pcVar1 = local_148.value.content.ptr;
  if (local_148.value.content.ptr != (char *)0x0) {
    local_148.value.content.ptr = (char *)0x0;
    local_148.value.content.size_ = 0;
    (**(local_148.value.content.disposer)->_vptr_ArrayDisposer)
              (local_148.value.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pRVar4 = local_f0;
  if (local_f0 != (ReadableFile *)0x0) {
    local_f0 = (ReadableFile *)0x0;
    (**(code **)*local_f8._vptr_FsNode)
              (local_f8._vptr_FsNode,
               (pRVar4->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar4->super_FsNode);
  }
  sVar2 = local_a8.parts.size_;
  pSVar3 = local_a8.parts.ptr;
  if (local_a8.parts.ptr != (String *)0x0) {
    local_a8.parts.ptr = (String *)0x0;
    local_a8.parts.size_ = 0;
    (**(local_a8.parts.disposer)->_vptr_ArrayDisposer)
              (local_a8.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_88.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[88],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,700,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"baz\\\", \\\"qux\\\"}))->readAllText() == \\\"bazqux\\\"\", _kjCondition"
               ,(char (*) [88])
                "failed: expected dst->openFile(Path({\"link\", \"baz\", \"qux\"}))->readAllText() == \"bazqux\""
               ,&local_88);
  }
  sVar2 = local_88.left.content.size_;
  pcVar1 = local_88.left.content.ptr;
  if ((String *)local_88.left.content.ptr != (String *)0x0) {
    local_88.left.content.ptr = (char *)0x0;
    local_88.left.content.size_ = 0;
    (**(local_88.left.content.disposer)->_vptr_ArrayDisposer)
              (local_88.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  pSVar3 = local_e0;
  local_88.left.content.ptr = "link";
  local_88.left.content.size_ = 5;
  local_88.left.content.disposer = (ArrayDisposer *)0x4d67ef;
  local_88.right = (char (*) [7])&DAT_00000004;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&local_88;
  Path::Path(&local_128,parts_03);
  uVar5 = (**(code **)((pSVar3->content).ptr + 0x40))
                    (pSVar3,local_128.parts.ptr,local_128.parts.size_);
  sVar2 = local_128.parts.size_;
  pSVar3 = local_128.parts.ptr;
  local_148.value.content.ptr = (char *)CONCAT71(local_148.value.content.ptr._1_7_,uVar5);
  if (local_128.parts.ptr != (String *)0x0) {
    local_128.parts.ptr = (String *)0x0;
    local_128.parts.size_ = 0;
    (**(local_128.parts.disposer)->_vptr_ArrayDisposer)
              (local_128.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if (((char)local_148.value.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2be,ERROR,
               "\"failed: expected \" \"dst->exists(Path({\\\"link\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected dst->exists(Path({\"link\", \"bar\"}))",
               (DebugExpression<bool> *)&local_148);
  }
  pSVar3 = local_d0;
  local_88.left.content.ptr = "foo";
  local_88.left.content.size_ = 4;
  local_88.left.content.disposer = (ArrayDisposer *)0x4d67ef;
  local_88.right = (char (*) [7])&DAT_00000004;
  parts_04.size_ = 2;
  parts_04.ptr = (StringPtr *)&local_88;
  Path::Path(&local_128,parts_04);
  Directory::remove((Directory *)pSVar3,(char *)local_128.parts.ptr);
  sVar2 = local_128.parts.size_;
  pSVar3 = local_128.parts.ptr;
  if (local_128.parts.ptr != (String *)0x0) {
    local_128.parts.ptr = (String *)0x0;
    local_128.parts.size_ = 0;
    (**(local_128.parts.disposer)->_vptr_ArrayDisposer)
              (local_128.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar3 = local_e0;
  local_88.left.content.ptr = "link";
  local_88.left.content.size_ = 5;
  local_88.left.content.disposer = (ArrayDisposer *)0x4d67ef;
  local_88.right = (char (*) [7])&DAT_00000004;
  parts_05.size_ = 2;
  parts_05.ptr = (StringPtr *)&local_88;
  Path::Path(&local_128,parts_05);
  uVar5 = (**(code **)((pSVar3->content).ptr + 0x40))
                    (pSVar3,local_128.parts.ptr,local_128.parts.size_);
  sVar2 = local_128.parts.size_;
  pSVar3 = local_128.parts.ptr;
  local_148.value.content.ptr = (char *)(CONCAT71(local_148.value.content.ptr._1_7_,uVar5) ^ 1);
  if (local_128.parts.ptr != (String *)0x0) {
    local_128.parts.ptr = (String *)0x0;
    local_128.parts.size_ = 0;
    (**(local_128.parts.disposer)->_vptr_ArrayDisposer)
              (local_128.parts.disposer,pSVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if (((char)local_148.value.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2c0,ERROR,
               "\"failed: expected \" \"!dst->exists(Path({\\\"link\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [53])"failed: expected !dst->exists(Path({\"link\", \"bar\"}))",
               (DebugExpression<bool> *)&local_148);
  }
  pSVar3 = local_e0;
  if (local_e0 != (String *)0x0) {
    local_e0 = (String *)0x0;
    (**(code **)*local_e8)
              (local_e8,(long)&(pSVar3->content).ptr + *(long *)((pSVar3->content).ptr + -0x10));
  }
  pSVar3 = local_d0;
  if (local_d0 != (String *)0x0) {
    local_d0 = (String *)0x0;
    (**(code **)*local_d8)
              (local_d8,(long)&(pSVar3->content).ptr + *(long *)((pSVar3->content).ptr + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }